

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItemPrivate::setIsMemberOfGroup(QGraphicsItemPrivate *this,bool enabled)

{
  QGraphicsItem **ppQVar1;
  long lVar2;
  QGraphicsItemGroup *pQVar3;
  undefined7 in_register_00000031;
  long lVar4;
  
  *(ulong *)&this->field_0x160 =
       *(ulong *)&this->field_0x160 & 0xffffffffffffefff |
       (ulong)(uint)((int)CONCAT71(in_register_00000031,enabled) << 0xc);
  pQVar3 = qgraphicsitem_cast<QGraphicsItemGroup*>(this->q_ptr);
  if (pQVar3 == (QGraphicsItemGroup *)0x0) {
    ppQVar1 = (this->children).d.ptr;
    lVar2 = (this->children).d.size;
    for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      setIsMemberOfGroup(*(QGraphicsItemPrivate **)(*(long *)((long)ppQVar1 + lVar4) + 8),enabled);
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setIsMemberOfGroup(bool enabled)
{
    Q_Q(QGraphicsItem);
    isMemberOfGroup = enabled;
    if (!qgraphicsitem_cast<QGraphicsItemGroup *>(q)) {
        for (QGraphicsItem *child : std::as_const(children))
            child->d_func()->setIsMemberOfGroup(enabled);
    }
}